

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

Vector<double,_6U> *
OpenMD::operator*(Vector<double,_6U> *__return_storage_ptr__,RectMatrix<double,_6U,_6U> *m,
                 Vector<double,_6U> *v)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  double dVar3;
  
  Vector<double,_6U>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    dVar3 = __return_storage_ptr__->data_[lVar1];
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (*(double (*) [6])*(double (*) [6])m)[lVar2] * v->data_[lVar2];
    }
    __return_storage_ptr__->data_[lVar1] = dVar3;
    m = (RectMatrix<double,_6U,_6U> *)((long)m + 0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<Real, Row> operator*(const RectMatrix<Real, Row, Col>& m,
                                     const Vector<Real, Col>& v) {
    Vector<Real, Row> result;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        result[i] += m(i, j) * v[j];

    return result;
  }